

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall
duckdb::PersistentColumnData::DeserializeField
          (PersistentColumnData *this,Deserializer *deserializer,field_id_t field_idx,
          char *field_name,LogicalType *type)

{
  _Elt_pointer prVar1;
  type ret;
  PersistentColumnData local_60;
  
  prVar1 = (deserializer->data).types.c.
           super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (prVar1 == (deserializer->data).types.c.
                super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::
    deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
    ::_M_push_back_aux<duckdb::LogicalType_const&>
              ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                *)&(deserializer->data).types,type);
  }
  else {
    prVar1->_M_data = type;
    (deserializer->data).types.c.
    super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = prVar1 + 1;
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,(ulong)field_idx,field_name);
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Deserialize(&local_60,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  ::std::vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>::
  emplace_back<duckdb::PersistentColumnData>
            (&(this->child_columns).
              super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
             ,&local_60);
  ~PersistentColumnData(&local_60);
  Deserializer::Unset<duckdb::LogicalType>(deserializer);
  return;
}

Assistant:

void PersistentColumnData::DeserializeField(Deserializer &deserializer, field_id_t field_idx, const char *field_name,
                                            const LogicalType &type) {
	deserializer.Set<const LogicalType &>(type);
	child_columns.push_back(deserializer.ReadProperty<PersistentColumnData>(field_idx, field_name));
	deserializer.Unset<LogicalType>();
}